

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cimgui.cpp
# Opt level: O3

void ImVector_ImDrawChannel_resizeT(ImVector_ImDrawChannel *self,int new_size,ImDrawChannel *v)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  ImDrawCmd *pIVar3;
  unsigned_short *puVar4;
  ImDrawChannel *pIVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  
  iVar8 = self->Capacity;
  if (iVar8 < new_size) {
    if (iVar8 == 0) {
      iVar8 = 8;
    }
    else {
      iVar8 = iVar8 / 2 + iVar8;
    }
    if (iVar8 <= new_size) {
      iVar8 = new_size;
    }
    pIVar5 = (ImDrawChannel *)ImGui::MemAlloc((long)iVar8 << 5);
    if (self->Data != (ImDrawChannel *)0x0) {
      memcpy(pIVar5,self->Data,(long)self->Size << 5);
      ImGui::MemFree(self->Data);
    }
    self->Data = pIVar5;
    self->Capacity = iVar8;
  }
  iVar8 = self->Size;
  if (iVar8 < new_size) {
    lVar7 = (long)new_size - (long)iVar8;
    lVar6 = (long)iVar8 << 5;
    do {
      pIVar5 = self->Data;
      uVar2 = *(undefined8 *)&v->_CmdBuffer;
      pIVar3 = (v->_CmdBuffer).Data;
      puVar4 = (v->_IdxBuffer).Data;
      puVar1 = (undefined8 *)((long)&(pIVar5->_IdxBuffer).Size + lVar6);
      *puVar1 = *(undefined8 *)&v->_IdxBuffer;
      puVar1[1] = puVar4;
      puVar1 = (undefined8 *)((long)&(pIVar5->_CmdBuffer).Size + lVar6);
      *puVar1 = uVar2;
      puVar1[1] = pIVar3;
      lVar6 = lVar6 + 0x20;
      lVar7 = lVar7 + -1;
    } while (lVar7 != 0);
  }
  self->Size = new_size;
  return;
}

Assistant:

CIMGUI_API void ImVector_ImDrawChannel_resizeT(ImVector_ImDrawChannel* self,int new_size,const ImDrawChannel v)
{
    return self->resize(new_size,v);
}